

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afglobal.c
# Opt level: O2

FT_Error af_face_globals_new(FT_Face face,AF_FaceGlobals *aglobals,AF_Module module)

{
  byte *pbVar1;
  FT_Face face_00;
  FT_UShort *gstyles;
  AF_StyleClass style_class;
  FT_Long FVar2;
  FT_Error FVar3;
  FT_UInt FVar4;
  AF_FaceGlobals globals;
  hb_font_t *phVar5;
  hb_buffer_t *phVar6;
  FT_ULong FVar7;
  long lVar8;
  FT_ULong charcode;
  long lVar9;
  ulong uVar10;
  AF_Script_UniRange pAVar11;
  uint local_68;
  FT_UInt local_64;
  FT_UInt gindex;
  FT_UInt local_5c;
  AF_FaceGlobals *local_58;
  FT_CharMap local_50;
  ulong local_48;
  AF_ScriptClass local_40;
  int local_34;
  
  globals = (AF_FaceGlobals)ft_mem_alloc(face->memory,face->num_glyphs * 2 + 0x308,&local_34);
  if (local_34 == 0) {
    globals->face = face;
    globals->glyph_count = face->num_glyphs;
    globals->glyph_styles = (FT_UShort *)(globals + 1);
    globals->module = module;
    globals->stem_darkening_for_ppem = 0;
    globals->standard_vertical_width = 0;
    globals->standard_horizontal_width = 0;
    globals->darken_x = 0;
    globals->darken_y = 0;
    globals->scale_down_factor = 0;
    phVar5 = (hb_font_t *)hb_ft_font_create(face,0);
    globals->hb_font = phVar5;
    phVar6 = (hb_buffer_t *)hb_buffer_create();
    globals->hb_buf = phVar6;
    face_00 = globals->face;
    local_50 = face_00->charmap;
    gstyles = globals->glyph_styles;
    FVar2 = globals->glyph_count;
    for (uVar10 = 0; (uint)FVar2 != uVar10; uVar10 = uVar10 + 1) {
      gstyles[uVar10] = 0x3fff;
    }
    FVar3 = FT_Select_Charmap(face_00,FT_ENCODING_UNICODE);
    if (FVar3 == 0) {
      local_68 = 0xffffffff;
      local_58 = aglobals;
      for (lVar9 = 0; aglobals = local_58, lVar9 != 0x54; lVar9 = lVar9 + 1) {
        style_class = af_style_classes[lVar9];
        local_40 = af_script_classes[style_class->script];
        pAVar11 = local_40->script_uni_ranges;
        if (pAVar11 != (AF_Script_UniRange)0x0) {
          if (style_class->coverage == AF_COVERAGE_DEFAULT) {
            local_5c = globals->module->default_script;
            local_48 = (ulong)style_class->script;
            while( true ) {
              FVar7 = (FT_ULong)pAVar11->first;
              if (FVar7 == 0) break;
              gindex = FT_Get_Char_Index(face_00,FVar7);
              if (gindex == 0) goto LAB_0017d671;
              uVar10 = (ulong)gindex;
              do {
                if ((uVar10 < (ulong)globals->glyph_count) && ((~gstyles[uVar10] & 0x3fff) == 0)) {
                  gstyles[uVar10] = (FT_UShort)lVar9;
                }
LAB_0017d671:
                FVar7 = FT_Get_Next_Char(face_00,FVar7,&gindex);
                uVar10 = (ulong)gindex;
              } while ((uVar10 != 0) && (FVar7 <= pAVar11->last));
              pAVar11 = pAVar11 + 1;
            }
            for (pAVar11 = local_40->script_uni_nonbase_ranges; FVar7 = (FT_ULong)pAVar11->first,
                FVar7 != 0; pAVar11 = pAVar11 + 1) {
              local_64 = FT_Get_Char_Index(face_00,FVar7);
              if (local_64 == 0) goto LAB_0017d6f5;
              uVar10 = (ulong)local_64;
              do {
                if ((uVar10 < (ulong)globals->glyph_count) &&
                   ((gstyles[uVar10] & 0x3fff) == (FT_UShort)lVar9)) {
                  gstyles[uVar10] = gstyles[uVar10] | 0x4000;
                }
LAB_0017d6f5:
                FVar7 = FT_Get_Next_Char(face_00,FVar7,&local_64);
                uVar10 = (ulong)local_64;
              } while ((uVar10 != 0) && (FVar7 <= pAVar11->last));
            }
            if ((FT_UInt)local_48 == local_5c) {
              local_68 = (uint)lVar9;
            }
          }
          else {
            af_shaper_get_coverage(globals,style_class,gstyles,'\0');
          }
        }
      }
      for (lVar9 = 0; lVar9 != 0x2a0; lVar9 = lVar9 + 8) {
        if ((*(AF_StyleClass *)((long)af_style_classes + lVar9))->coverage == AF_COVERAGE_DEFAULT) {
          af_shaper_get_coverage
                    (globals,*(AF_StyleClass *)((long)af_style_classes + lVar9),gstyles,'\0');
        }
      }
      af_shaper_get_coverage(globals,af_style_classes[local_68],gstyles,'\x01');
      for (FVar7 = 0x30; FVar7 != 0x3a; FVar7 = FVar7 + 1) {
        FVar4 = FT_Get_Char_Index(face_00,FVar7);
        if ((FVar4 != 0) && ((ulong)FVar4 < (ulong)globals->glyph_count)) {
          pbVar1 = (byte *)((long)gstyles + (ulong)FVar4 * 2 + 1);
          *pbVar1 = *pbVar1 | 0x80;
        }
      }
    }
    FVar4 = globals->module->fallback_style;
    if (FVar4 != 0x3fff) {
      lVar8 = 0;
      lVar9 = globals->glyph_count;
      if (globals->glyph_count < 1) {
        lVar9 = lVar8;
      }
      for (; lVar9 != lVar8; lVar8 = lVar8 + 1) {
        if ((~gstyles[lVar8] & 0x3fff) == 0) {
          gstyles[lVar8] = gstyles[lVar8] & 0xc000 | (ushort)FVar4;
        }
      }
    }
    FT_Set_Charmap(face_00,local_50);
    globals->increase_x_height = 0;
    local_34 = 0;
  }
  *aglobals = globals;
  return local_34;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_face_globals_new( FT_Face          face,
                       AF_FaceGlobals  *aglobals,
                       AF_Module        module )
  {
    FT_Error        error;
    FT_Memory       memory;
    AF_FaceGlobals  globals = NULL;


    memory = face->memory;

    /* we allocate an AF_FaceGlobals structure together */
    /* with the glyph_styles array                      */
    if ( FT_ALLOC( globals,
                   sizeof ( *globals ) +
                     (FT_ULong)face->num_glyphs * sizeof ( FT_UShort ) ) )
      goto Exit;

    globals->face                      = face;
    globals->glyph_count               = face->num_glyphs;
    /* right after the globals structure come the glyph styles */
    globals->glyph_styles              = (FT_UShort*)( globals + 1 );
    globals->module                    = module;
    globals->stem_darkening_for_ppem   = 0;
    globals->darken_x                  = 0;
    globals->darken_y                  = 0;
    globals->standard_vertical_width   = 0;
    globals->standard_horizontal_width = 0;
    globals->scale_down_factor         = 0;

#ifdef FT_CONFIG_OPTION_USE_HARFBUZZ
    globals->hb_font = hb_ft_font_create( face, NULL );
    globals->hb_buf  = hb_buffer_create();
#endif

    error = af_face_globals_compute_style_coverage( globals );
    if ( error )
    {
      af_face_globals_free( globals );
      globals = NULL;
    }
    else
      globals->increase_x_height = AF_PROP_INCREASE_X_HEIGHT_MAX;

  Exit:
    *aglobals = globals;
    return error;
  }